

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O3

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::stop
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this)

{
  basic_socket_acceptor<asio::ip::tcp> *pbVar1;
  pthread_mutex_t *__mutex;
  impl_type *piVar2;
  reactor *prVar3;
  byte bVar4;
  int iVar5;
  undefined8 uVar6;
  implementation_type *piVar7;
  _Hashtable<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Identity,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  _Hash_node_base *p_Var8;
  bool bVar9;
  error_code ec;
  scoped_lock local_48;
  undefined1 local_34 [20];
  undefined8 local_20;
  
  pbVar1 = (this->acceptor)._M_t.
           super___uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl;
  if (pbVar1 != (basic_socket_acceptor<asio::ip::tcp> *)0x0) {
    local_34._12_4_ = 0;
    local_20 = std::_V2::system_category();
    piVar7 = &(pbVar1->
              super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
              implementation_;
    asio::detail::reactive_socket_service_base::close
              ((reactive_socket_service_base *)
               ((long)(pbVar1->
                      super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                      ).service_ + 0x28),(int)piVar7);
    __mutex = (pthread_mutex_t *)
              (this->connections_mutex).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar5 = pthread_mutex_lock(__mutex);
    if (iVar5 != 0) {
      uVar6 = std::__throw_system_error(iVar5);
      __clang_call_terminate(uVar6);
    }
    this_00 = &((this->connections).
                super___shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_h;
    p_Var8 = (this_00->_M_before_begin)._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      do {
        Connection::close((Connection *)p_Var8[1]._M_nxt,(int)piVar7);
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
      this_00 = &((this->connections).
                  super___shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_M_h;
    }
    std::
    _Hashtable<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Identity,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(this_00);
    pthread_mutex_unlock(__mutex);
    if (this->internal_io_service != false) {
      piVar2 = ((this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->impl_;
      local_48.mutex_ = &piVar2->mutex_;
      bVar4 = (piVar2->mutex_).enabled_;
      bVar9 = (bool)bVar4 == true;
      if (bVar9) {
        pthread_mutex_lock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
        bVar4 = (piVar2->mutex_).enabled_;
      }
      piVar2->stopped_ = true;
      local_48.locked_ = bVar9;
      if ((bVar4 & 1) != 0) {
        asio::detail::posix_event::
        signal_all<asio::detail::conditionally_enabled_mutex::scoped_lock>
                  (&(piVar2->wakeup_event_).event_,&local_48);
      }
      if ((piVar2->task_interrupted_ == false) && (prVar3 = piVar2->task_, prVar3 != (reactor *)0x0)
         ) {
        piVar2->task_interrupted_ = true;
        local_34._0_4_ = 0x80000009;
        local_34._4_8_ = &prVar3->interrupter_;
        epoll_ctl(prVar3->epoll_fd_,3,(prVar3->interrupter_).read_descriptor_,
                  (epoll_event *)local_34);
      }
      if (local_48.locked_ == true) {
        pthread_mutex_unlock((pthread_mutex_t *)&(local_48.mutex_)->mutex_);
      }
    }
  }
  return;
}

Assistant:

void write(StatusCode status_code, std::istream &content, const CaseInsensitiveMultimap &header = CaseInsensitiveMultimap()) {
        *this << "HTTP/1.1 " << SimpleWeb::status_code(status_code) << "\r\n";
        content.seekg(0, std::ios::end);
        auto size = content.tellg();
        content.seekg(0, std::ios::beg);
        write_header(header, size);
        if(size)
          *this << content.rdbuf();
      }